

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-vfp.inc.c
# Opt level: O1

_Bool trans_VMOV_imm_dp(DisasContext_conflict1 *s,arg_VMOV_imm_dp *a)

{
  uint uVar1;
  TCGContext_conflict1 *tcg_ctx;
  _Bool _Var2;
  TCGv_i64 pTVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  TCGTemp *ts;
  
  uVar1 = s->isar->mvfr0;
  if (((uVar1 & 0xe00) != 0) && (uVar6 = a->vd, (uVar6 & 0x10) == 0 || (uVar1 & 0xe) != 0)) {
    tcg_ctx = s->uc->tcg_ctx;
    iVar5 = s->vec_len;
    if (((uVar1 & 0xf000000) != 0) || ((iVar5 == 0 && (s->vec_stride == 0)))) {
      iVar4 = 0;
      _Var2 = full_vfp_access_check(s,false);
      if (!_Var2) {
        return true;
      }
      if (0 < iVar5) {
        if ((uVar6 & 0xc) == 0) {
          iVar4 = 0;
          iVar5 = 0;
        }
        else {
          iVar4 = (s->vec_stride >> 1) + 1;
        }
      }
      uVar1 = a->imm;
      pTVar3 = tcg_const_i64_aarch64
                         (tcg_ctx,(ulong)((uint)((uVar1 & 0x40) == 0) * 0x40 +
                                          (uVar1 & 0x3f | (uVar1 & 0x80) << 8) + 0x3fc0) << 0x30);
      ts = (TCGTemp *)(pTVar3 + (long)tcg_ctx);
      tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_st_i64,(TCGArg)ts,
                          (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),
                          (ulong)(uVar6 >> 1) * 0x100 + (ulong)(uVar6 & 1) * 8 + 0xc10);
      for (; iVar5 != 0; iVar5 = iVar5 + -1) {
        uVar1 = iVar4 + uVar6;
        uVar6 = uVar6 & 0xfffffffc | uVar1 & 3;
        tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_st_i64,(TCGArg)ts,
                            (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),
                            (ulong)(uVar6 >> 1) * 0x100 + (ulong)(uVar1 & 1) * 8 + 0xc10);
      }
      tcg_temp_free_internal_aarch64(tcg_ctx,ts);
      return true;
    }
  }
  return false;
}

Assistant:

static bool trans_VMOV_imm_dp(DisasContext *s, arg_VMOV_imm_dp *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    uint32_t delta_d = 0;
    int veclen = s->vec_len;
    TCGv_i64 fd;
    uint32_t vd;

    vd = a->vd;

    if (!dc_isar_feature(aa32_fpdp_v3, s)) {
        return false;
    }

    /* UNDEF accesses to D16-D31 if they don't exist. */
    if (!dc_isar_feature(aa32_simd_r32, s) && (vd & 0x10)) {
        return false;
    }

    if (!dc_isar_feature(aa32_fpshvec, s) &&
        (veclen != 0 || s->vec_stride != 0)) {
        return false;
    }

    if (!vfp_access_check(s)) {
        return true;
    }

    if (veclen > 0) {
        /* Figure out what type of vector operation this is.  */
        if (vfp_dreg_is_scalar(vd)) {
            /* scalar */
            veclen = 0;
        } else {
            delta_d = (s->vec_stride >> 1) + 1;
        }
    }

    fd = tcg_const_i64(tcg_ctx, vfp_expand_imm(MO_64, a->imm));

    for (;;) {
        neon_store_reg64(tcg_ctx, fd, vd);

        if (veclen == 0) {
            break;
        }

        /* Set up the operands for the next iteration */
        veclen--;
        vd = vfp_advance_dreg(vd, delta_d);
    }

    tcg_temp_free_i64(tcg_ctx, fd);
    return true;
}